

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pass2.cpp
# Opt level: O0

uchar * __thiscall cs222::Pass2::string_to_hex(Pass2 *this,string *input)

{
  ulong uVar1;
  ulong in_RDX;
  ulong uStack_48;
  uchar c;
  size_t i;
  size_t len;
  string *input_local;
  Pass2 *this_local;
  string *output;
  
  uVar1 = std::__cxx11::string::length();
  std::__cxx11::string::string((string *)this);
  std::__cxx11::string::reserve((ulong)this);
  for (uStack_48 = 0; uStack_48 < uVar1; uStack_48 = uStack_48 + 1) {
    std::__cxx11::string::operator[](in_RDX);
    std::__cxx11::string::push_back((char)this);
    std::__cxx11::string::push_back((char)this);
  }
  return (uchar *)this;
}

Assistant:

std::string Pass2::string_to_hex(const std::string& input)
    {
        static const char* const lut = "0123456789ABCDEF";
        size_t len = input.length();

        std::string output;
        output.reserve(2 * len);
        for (size_t i = 0; i < len; ++i)
        {
            const unsigned char c = input[i];
            output.push_back(lut[c >> 4]);
            output.push_back(lut[c & 15]);
        }
        return output;
    }